

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

int sc_jsf(int *u0,int *u1,limb_t *a,limb_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  
  lVar11 = 0;
  lVar8 = 0;
  uVar3 = 0;
  piVar5 = u0;
  piVar9 = u1;
  for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
    lVar11 = lVar11 + a[lVar10];
    lVar8 = lVar8 + b[lVar10];
    uVar3 = uVar3 + 0x34;
    for (lVar4 = 0; (int)lVar4 != 0x34; lVar4 = lVar4 + 1) {
      iVar1 = jsfdigit((uint)lVar11,(uint)lVar8);
      piVar5[lVar4] = iVar1;
      iVar1 = jsfdigit((uint)lVar8,(uint)lVar11);
      piVar9[lVar4] = iVar1;
      lVar11 = lVar11 - piVar5[lVar4] >> 1;
      lVar8 = lVar8 - iVar1 >> 1;
    }
    piVar9 = piVar9 + 0x34;
    piVar5 = piVar5 + 0x34;
  }
  iVar1 = jsfdigit((uint)lVar11,(uint)lVar8);
  u0[(int)uVar3] = iVar1;
  iVar1 = jsfdigit((uint)lVar8,(uint)lVar11);
  u1[(int)uVar3] = iVar1;
  uVar7 = (ulong)uVar3;
  uVar2 = 0xffffffff;
  if ((int)uVar3 < -1) {
    uVar2 = uVar3;
  }
  while (((uVar6 = (uint)uVar7, uVar3 = uVar2, -1 < (int)uVar6 && (uVar3 = uVar6, u0[uVar7] == 0))
         && (u1[uVar7] == 0))) {
    uVar7 = (ulong)(uVar6 - 1);
  }
  return uVar3;
}

Assistant:

int
sc_jsf(int u0[SC_BITS+1], int u1[SC_BITS+1], const sc_t a, const sc_t b)
{
	limb_t n0, n1;
	int i, j, k;

	k = n0 = n1 = 0;

	for (i = 0; i < K; i++) {
		n0 += a[i];
		n1 += b[i];

		for (j = 0; j < LB; j++, k++) {
			u0[k] = jsfdigit(n0, n1);
			u1[k] = jsfdigit(n1, n0);

			n0 = (n0 - u0[k]) >> 1;
			n1 = (n1 - u1[k]) >> 1;
		}
	}
	u0[k] = jsfdigit(n0, n1);
	u1[k] = jsfdigit(n1, n0);

	while (k >= 0 && u0[k] == 0 && u1[k] == 0)
		k--;

	return k;
}